

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckIfInTargetLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  bool bVar2;
  AActor *other;
  uint uVar3;
  int val;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  AActor *this;
  double dVar7;
  double dVar8;
  void *pvVar9;
  _func_int **local_38;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e770e;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e76fe:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e770e:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x111e,
                  "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003e738b;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e770e;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003e76fe;
LAB_003e738b:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e777d:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x111f,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pvVar9 = param[1].field_0.field_1.a;
LAB_003e73e5:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e77bb:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1120,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar3 = param[2].field_0.i;
LAB_003e73f4:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e774c:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1121,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar8 = param[3].field_0.f;
LAB_003e7405:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e772d:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1122,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e777d;
    }
    pvVar9 = (void *)param[1].field_0.f;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e73e5;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e77bb;
    }
    uVar3 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e73f4;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e774c;
    }
    dVar8 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e7405;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e772d;
    }
  }
  dVar1 = param[4].field_0.f;
  lVar5 = 0x280;
  if ((((((uVar3 & 0x40) == 0) && (lVar5 = 0x208, (uVar3 & 1) != 0)) &&
       (((this->flags).Value & 0x10000) != 0)) &&
      (lVar5 = 0x278, ((this->flags2).Value & 0x40000000) == 0)) ||
     (other = GC::ReadBarrier<AActor>
                        ((AActor **)
                         ((long)&(this->super_DThinker).super_DObject._vptr_DObject + lVar5)),
     other == (AActor *)0x0)) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1138,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else if (((uVar3 & 0x20) == 0) || (0 < other->health)) {
    dVar7 = AActor::Distance3D(this,other,false);
    if (((dVar8 == 0.0) && (!NAN(dVar8))) || (dVar7 <= dVar8)) {
      uVar6 = uVar3 & 2;
      if (((dVar1 != 0.0) || (NAN(dVar1))) && (dVar7 < dVar1)) {
        if ((uVar3 & 0x10) != 0) {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x114d,
                          "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          goto LAB_003e74ea;
        }
        if ((uVar3 & 4) != 0) {
          pvVar9 = (void *)0x0;
        }
        uVar6 = uVar3 & 10;
      }
      if ((((double)pvVar9 <= 0.0) || (360.0 <= (double)pvVar9)) ||
         (AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(this,0)),
         ABS((double)SUB84(((double)local_38 - (other->Angles).Yaw.Degrees) * 11930464.711111112 +
                           6755399441055744.0,0) * 8.381903171539307e-08) <= (double)pvVar9 * 0.5))
      {
        if ((uVar6 != 0) || (bVar2 = P_CheckSight(other,this,1), bVar2)) {
          if (0 < numret) {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1163,
                            "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            val = 1;
            goto LAB_003e769d;
          }
        }
        else if (0 < numret) {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1161,
                          "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          val = 0;
LAB_003e769d:
          VMReturn::SetInt(ret,val);
          return 1;
        }
        return 0;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x115c,
                      "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1144,
                      "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
  }
  else {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x113d,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
LAB_003e74ea:
  VMReturn::SetInt(ret,0);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_BOOL(false);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_BOOL(false);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}